

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resource.cpp
# Opt level: O2

void __thiscall CampResource_ConvertFails_Test::TestBody(CampResource_ConvertFails_Test *this)

{
  bool bVar1;
  AssertHelper local_70;
  char *local_68;
  undefined8 local_60;
  char local_58 [24];
  AssertionResult gtest_ar_;
  Resource h1;
  
  camp::resources::v1::Resource::Resource<camp::resources::v1::Host,void>(&h1,(Host *)&local_68);
  camp::resources::v1::Resource::get<camp::resources::v1::Host>(&h1);
  local_68 = local_58;
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_60 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    camp::resources::v1::Resource::get<Host2>(&h1);
  }
  std::__cxx11::string::assign((char *)&local_68);
  testing::Message::Message((Message *)&gtest_ar_);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/test/resource.cpp",0x1e,
             local_68);
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (gtest_ar_._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&h1.m_value.
              super___shared_ptr<camp::resources::v1::Resource::ContextInterface,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

TEST(CampResource, ConvertFails)
{
  Resource h1{Host()};
  h1.get<Host>();
  ASSERT_THROW(h1.get<Host2>(), std::runtime_error);
  ASSERT_FALSE(h1.try_get<Host2>());
}